

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O2

void __thiscall Fluid::step(Fluid *this)

{
  particle_to_grid(this);
  apply_body_forces(this,0.02);
  setup_grid_project(this,0.02);
  pressure_solve(this);
  pressure_update(this,0.02);
  grid_to_particle(this);
  particle_advect(this,0.02);
  return;
}

Assistant:

void step() {
        const float dt = 0.02;
        particle_to_grid();
        // extrapolate();
        apply_body_forces(dt);
        setup_grid_project(dt);
        pressure_solve();
        pressure_update(dt);
        grid_to_particle();
        particle_advect(dt);
    }